

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_adios.cpp
# Opt level: O2

adios2_error adios2_enter_computation_block(adios2_adios *adios)

{
  allocator local_48 [32];
  string local_28;
  
  std::__cxx11::string::string
            ((string *)&local_28,"for adios2_adios, in call to adios2_enter_computation_block",
             local_48);
  adios2::helper::CheckForNullptr<adios2_adios>(adios,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  adios2::core::ADIOS::EnterComputationBlock();
  return adios2_error_none;
}

Assistant:

adios2_error adios2_enter_computation_block(adios2_adios *adios)
{
    try
    {
        adios2::helper::CheckForNullptr(
            adios, "for adios2_adios, in call to adios2_enter_computation_block");
        reinterpret_cast<adios2::core::ADIOS *>(adios)->EnterComputationBlock();
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_enter_computation_block"));
    }
}